

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

Expression * __thiscall
soul::BlockBuilder::createIntegerChangedByOne(BlockBuilder *this,Expression *v,Op op)

{
  int iVar1;
  undefined4 extraout_var;
  Constant *rhs;
  Expression *pEVar2;
  CodeLocation local_b8;
  Value local_a8;
  Value local_68;
  
  iVar1 = (*(v->super_Object)._vptr_Object[2])(v);
  if ((((Type *)CONCAT44(extraout_var,iVar1))->primitiveType).type - int32 < 2) {
    soul::Value::Value(&local_68,1);
    soul::Value::castToTypeExpectingSuccess
              (&local_a8,&local_68,(Type *)CONCAT44(extraout_var,iVar1));
    rhs = createConstant(this,&local_a8);
    soul::Value::~Value(&local_a8);
    soul::Value::~Value(&local_68);
    local_b8.sourceCode.object = (v->super_Object).location.sourceCode.object;
    if (local_b8.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_b8.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_b8.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_b8.location.data = (v->super_Object).location.location.data;
    pEVar2 = createBinaryOp(this,&local_b8,v,&rhs->super_Expression,op);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_b8.sourceCode);
    return pEVar2;
  }
  throwInternalCompilerError("type.isInteger()","createIntegerChangedByOne",0xec);
}

Assistant:

heart::Expression& createIntegerChangedByOne (heart::Expression& v, BinaryOp::Op op)
    {
        const auto& type = v.getType();
        SOUL_ASSERT (type.isInteger());
        auto& one = createConstant (Value::createInt32 (1).castToTypeExpectingSuccess (type));
        return createBinaryOp (v.location, v, one, op);
    }